

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_swift_service_client_async_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar5;
  char *pcVar6;
  pointer pptVar7;
  string error_completion_call;
  string protocol_name;
  string name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_d0;
  string local_b0;
  char *local_90;
  long local_88;
  char local_80 [16];
  char *local_70;
  long local_68;
  char local_60 [16];
  t_service *local_50;
  vector<t_function_*,_std::allocator<t_function_*>_> local_48;
  
  if (this->gen_cocoa_ == true) {
    generate_old_swift_service_client_async_implementation(this,out,tservice);
    return;
  }
  iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_70 = local_60;
  lVar3 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar3,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar3);
  std::__cxx11::string::append((char *)&local_70);
  local_50 = tservice;
  iVar4 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_90 = local_80;
  lVar3 = *(long *)CONCAT44(extraout_var_00,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar3,((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar3);
  std::__cxx11::string::append((char *)&local_90);
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"extension ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_90,local_88);
  block_open(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_48,&local_50->functions_);
  for (pptVar7 = local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar7 !=
      local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    generate_swift_service_client_send_function_implementation(this,out,local_50,*pptVar7,true);
    if ((*pptVar7)->oneway_ == false) {
      generate_swift_service_client_recv_function_implementation(this,out,local_50,*pptVar7,true);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"public ",7);
    async_function_signature_abi_cxx11_(&local_b0,this,*pptVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    block_open(this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"let transport   = factory.newTransport()",0x28);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"let proto = Protocol(on: transport)",0x23);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"do",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    block_open(this,out);
    generate_swift_service_client_send_async_function_invocation(this,out,*pptVar7);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} catch let error {",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"completion(.error(error))",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    block_close(this,out,true);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar4 = (*((*pptVar7)->returntype_->super_t_doc)._vptr_t_doc[4])();
    bVar2 = (*pptVar7)->oneway_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"completion(.error(error))","");
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"transport.flush",0xf);
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(trans, error) in",0x11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if let error = error",0x14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    block_open(this,out);
    t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    block_close(this,out,true);
    if (bVar2 == false) {
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"do",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      block_open(this,out);
      t_generator::indent((t_generator *)this,out);
      if ((char)iVar4 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(out,"let result = ",0xd);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"try self.recv_",0xe);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,((*pptVar7)->name_)._M_dataplus._M_p,
                          ((*pptVar7)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(on: proto)",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      pcVar6 = "completion(.success(result))";
      if ((char)iVar4 != '\0') {
        pcVar6 = "completion(.success(Void()))";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"} catch let error {",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      block_close(this,out,true);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"completion(.success(Void()))",0x1c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    block_close(this,out,true);
    block_close(this,out,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_async_implementation(ostream& out, t_service* tservice) {
  if (gen_cocoa_) {
    generate_old_swift_service_client_async_implementation(out, tservice);
    return;
  }
  string name = tservice->get_name() + "AsyncClient";
  string protocol_name = tservice->get_name() + "Async";

  indent(out) << "extension " << name << " : " << protocol_name;
  block_open(out);
  out << endl;

  // generate client method implementations
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {

    generate_swift_service_client_send_function_implementation(out, tservice, *f_iter, true);

    if (!(*f_iter)->is_oneway()) {
      generate_swift_service_client_recv_function_implementation(out, tservice, *f_iter, true);
    }

    indent(out) << "public " << async_function_signature(*f_iter);
    block_open(out);
    out << endl;
    out << indent() << "let transport   = factory.newTransport()" << endl
        << indent() << "let proto = Protocol(on: transport)" << endl
        << endl;

    out << indent() << "do";
    block_open(out);

    generate_swift_service_client_send_async_function_invocation(out, *f_iter);

    indent_down();
    out << indent() << "} catch let error {" << endl;
    indent_up();
    out << indent() << "completion(.error(error))" << endl;
    block_close(out);

    out << endl;

    bool ret_is_void = (*f_iter)->get_returntype()->is_void();
    bool is_oneway = (*f_iter)->is_oneway();

    string error_completion_call = "completion(.error(error))";
    indent(out) << "transport.flush";
    block_open(out);
    out << indent() << "(trans, error) in" << endl << endl;
    out << indent() << "if let error = error";
    block_open(out);
    out << indent() << error_completion_call << endl;
    block_close(out);

    if (!is_oneway) {
      out << indent() << "do";
      block_open(out);
      indent(out);
      if (!ret_is_void) {
        out << "let result = ";
      }
      out << "try self.recv_" << (*f_iter)->get_name() << "(on: proto)" << endl;

      out << indent() << (ret_is_void ? "completion(.success(Void()))" : "completion(.success(result))") << endl;
      indent_down();
      out << indent() << "} catch let error {" << endl;
      indent_up();
      out << indent() << error_completion_call << endl;

      block_close(out);
    } else {
      out << indent() << "completion(.success(Void()))" << endl;
    }
    block_close(out);
    block_close(out);

  }
  block_close(out);
  out << endl;
}